

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_func.cpp
# Opt level: O2

void __thiscall FParser::SF_HealObj(FParser *this)

{
  int iVar1;
  AActor *this_00;
  AActor *pAVar2;
  
  if (this->t_argc == 0) {
    this_00 = GC::ReadBarrier<AActor>((AActor **)&this->Script->trigger);
  }
  else {
    this_00 = actorvalue(this->t_argv);
  }
  if (this->t_argc < 2) {
    pAVar2 = AActor::GetDefault(this_00);
    iVar1 = pAVar2->health;
  }
  else {
    if (this->t_argc != 2) {
      script_error("invalid number of arguments for objheal");
      return;
    }
    iVar1 = intvalue(this->t_argv + 1);
    iVar1 = iVar1 + this_00->health;
  }
  this_00->health = iVar1;
  if (this_00->player != (player_t *)0x0) {
    this_00->player->health = iVar1;
  }
  return;
}

Assistant:

void FParser::SF_HealObj()  //no pain sound
{
	// use trigger object if not specified
	AActor *mo;
	if(t_argc)
	{
		mo = actorvalue(t_argv[0]);
	}
	else
	{
		mo = Script->trigger;
	}

	if(t_argc < 2)
	{
		mo->health = mo->GetDefault()->health;
		if(mo->player) mo->player->health = mo->health;
	}

	else if (t_argc == 2)
	{
		mo->health += intvalue(t_argv[1]);
		if(mo->player) mo->player->health = mo->health;
	}

	else
		script_error("invalid number of arguments for objheal");
}